

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O2

void __thiscall
QTextHtmlParserNode::applyCssDeclarations
          (QTextHtmlParserNode *this,QList<QCss::Declaration> *declarations,
          QTextDocument *resourceProvider)

{
  QTextCharFormat *this_00;
  QTextBlockFormat *this_01;
  QPalette *pal;
  Property PVar1;
  long lVar2;
  Declaration *pDVar3;
  Value *pVVar4;
  qreal qVar5;
  DataPtr DVar6;
  double *pdVar7;
  bool bVar8;
  ushort uVar9;
  int iVar10;
  int iVar11;
  BorderStyle BVar12;
  PageBreakFlags PVar13;
  QFlagsStorage<QTextFormat::PageBreakFlag> flags;
  qint64 searchKey;
  undefined1 *puVar14;
  long lVar15;
  QFlagsStorage<Qt::AlignmentFlag> aalignment;
  VerticalAlignment alignment;
  UnderlineStyle style;
  DeclarationData *pDVar16;
  int i;
  ulong uVar17;
  long in_FS_OFFSET;
  QColor QVar18;
  QTextLength QVar19;
  QTextLength maxWidth;
  Attachment ignoredAttachment;
  Origin ignoredClip;
  Origin ignoredOrigin;
  bool ok;
  undefined7 uStack_f7;
  Repeat ignoredRepeat;
  QFlagsStorage<Qt::AlignmentFlag> local_e8;
  int adjustment;
  anon_class_8_1_068654c4 local_e0;
  ValueExtractor extractor;
  QPen pen_1;
  anon_union_24_3_e3d07ef4_for_data aStack_90;
  undefined1 *local_78;
  qreal lineHeight;
  undefined1 *puStack_60;
  QPen pen;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  extractor.pal.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  extractor.pal._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  extractor.f._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  extractor._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  extractor.declarations.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  extractor.f.d.d.ptr = (totally_ordered_wrapper<QFontPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
  extractor.declarations.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  extractor.declarations.d.ptr = (Declaration *)&DAT_aaaaaaaaaaaaaaaa;
  QPalette::QPalette((QPalette *)&pen_1);
  QCss::ValueExtractor::ValueExtractor(&extractor,declarations,(QPalette *)&pen_1);
  QPalette::~QPalette((QPalette *)&pen_1);
  QCss::ValueExtractor::extractBox(&extractor,this->margin,this->padding,(int *)0x0);
  local_e0.extractor = &extractor;
  if ((uint)(this->id + ~Html_tr) < 2) {
    applyCssDeclarations::anon_class_8_1_068654c4::operator()
              (&local_e0,this->tableCellBorder,(QBrush *)&this->field_0x170,
               this->tableCellBorderStyle);
  }
  this_00 = &this->charFormat;
  this_01 = &this->blockFormat;
  uVar17 = 0;
  do {
    if ((ulong)(declarations->d).size <= uVar17) {
      lineHeight = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      QFont::QFont((QFont *)&lineHeight);
      adjustment = -0xff;
      QCss::ValueExtractor::extractFont(&extractor,(QFont *)&lineHeight,&adjustment);
      iVar10 = QFont::pixelSize((QFont *)&lineHeight);
      if (0x3fffffff < iVar10) {
        QFont::setPixelSize((QFont *)&lineHeight,0x3fffffff);
      }
      QTextCharFormat::setFont(this_00,(QFont *)&lineHeight,FontPropertiesSpecifiedOnly);
      if (-2 < adjustment) {
        ::QVariant::QVariant((QVariant *)&pen_1,adjustment);
        QTextFormat::setProperty(&this_00->super_QTextFormat,0x2002,(QVariant *)&pen_1);
        ::QVariant::~QVariant((QVariant *)&pen_1);
      }
      local_e8.i = 0;
      ignoredRepeat = 0xaaaaaaaa;
      pen.d.d.ptr = (DataPtr)(totally_ordered_wrapper<QPenPrivate_*>)0x0;
      _ok = (QBrushData *)&DAT_aaaaaaaaaaaaaaaa;
      QBrush::QBrush((QBrush *)&ok);
      ignoredOrigin = 0xaaaaaaaa;
      ignoredClip = 0xaaaaaaaa;
      ignoredAttachment = 0xaaaaaaaa;
      QCss::ValueExtractor::extractBackground
                (&extractor,(QBrush *)&ok,(QString *)&pen,&ignoredRepeat,(Alignment *)&local_e8,
                 &ignoredOrigin,&ignoredAttachment,&ignoredClip);
      if ((*(int *)((long)_ok + 4) != 0) &&
         (QTextFormat::setBackground(&this_00->super_QTextFormat,(QBrush *)&ok), this->id == Html_hr
         )) {
        QBrush::operator_cast_to_QVariant((QVariant *)&pen_1,(QBrush *)&ok);
        QTextFormat::setProperty(&this_01->super_QTextFormat,0x820,(QVariant *)&pen_1);
        ::QVariant::~QVariant((QVariant *)&pen_1);
      }
      QBrush::~QBrush((QBrush *)&ok);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pen);
      QFont::~QFont((QFont *)&lineHeight);
      QCss::ValueExtractor::~ValueExtractor(&extractor);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return;
    }
    pDVar3 = (declarations->d).ptr;
    pDVar16 = pDVar3[uVar17].d.d.ptr;
    if ((pDVar16->values).d.size == 0) goto switchD_00495f22_caseD_13;
    pal = (QPalette *)(pDVar3 + uVar17);
    pVVar4 = (pDVar16->values).d.ptr;
    iVar10 = 0;
    if (pVVar4->type == KnownIdentifier) {
      iVar10 = ::QVariant::toInt((bool *)&pVVar4->variant);
      pDVar16 = (DeclarationData *)pal->d;
    }
    PVar1 = pDVar16->propertyId;
    switch(PVar1) {
    case ListStyleType:
    case ListStyle:
      setListStyle(this,&pDVar16->values);
      break;
    case QtImageAlignment:
    case Outline:
    case OutlineOffset:
    case OutlineWidth:
    case OutlineColor:
    case OutlineStyle:
    case OutlineRadius:
    case OutlineTopLeftRadius:
    case OutlineTopRightRadius:
    case OutlineBottomLeftRadius:
    case OutlineBottomRightRadius:
    case FontVariant:
    case TextTransform:
    case FontKerning:
    case QtIcon:
    case LetterSpacing:
    case WordSpacing:
    case QtPlaceHolderTextColor:
    case QtAccent:
      break;
    case TextAlignment:
      if (iVar10 == 0x17) {
        aalignment.i = 0x84;
      }
      else if (iVar10 == 0x14) {
        aalignment.i = 2;
      }
      else {
        if (iVar10 != 0x13) break;
        aalignment.i = 1;
      }
      QTextBlockFormat::setAlignment(this_01,(Alignment)aalignment.i);
      break;
    case QtListNumberPrefix:
      ::QVariant::toString();
      DVar6.d.ptr = (totally_ordered_wrapper<QPenPrivate_*>)(this->textListNumberPrefix).d.d;
      pdVar7 = (double *)(this->textListNumberPrefix).d.ptr;
      (this->textListNumberPrefix).d.d = (Data *)pen_1.d.d.ptr;
      (this->textListNumberPrefix).d.ptr = (char16_t *)aStack_90._0_8_;
      puVar14 = (undefined1 *)(this->textListNumberPrefix).d.size;
      (this->textListNumberPrefix).d.size = aStack_90._8_8_;
      pen_1.d.d.ptr = (DataPtr)(DataPtr)DVar6.d.ptr;
      aStack_90.shared = (PrivateShared *)pdVar7;
      goto LAB_0049651b;
    case QtListNumberSuffix:
      ::QVariant::toString();
      DVar6.d.ptr = (totally_ordered_wrapper<QPenPrivate_*>)(this->textListNumberSuffix).d.d;
      pdVar7 = (double *)(this->textListNumberSuffix).d.ptr;
      (this->textListNumberSuffix).d.d = (Data *)pen_1.d.d.ptr;
      (this->textListNumberSuffix).d.ptr = (char16_t *)aStack_90._0_8_;
      puVar14 = (undefined1 *)(this->textListNumberSuffix).d.size;
      (this->textListNumberSuffix).d.size = aStack_90._8_8_;
      pen_1.d.d.ptr = (DataPtr)(DataPtr)DVar6.d.ptr;
      aStack_90.shared = (PrivateShared *)pdVar7;
LAB_0049651b:
      aStack_90._8_8_ = puVar14;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pen_1);
      break;
    case LineHeight:
      lineHeight = -NAN;
      bVar8 = QCss::Declaration::realValue((Declaration *)pal,&lineHeight,"px");
      iVar10 = 3;
      if (!bVar8) {
        ok = true;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        aStack_90._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        aStack_90._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        pen_1.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
        aStack_90._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QCss::Value::Value((Value *)&pen_1,*(Value **)&pal->d[1].detach_no);
        pen.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
        QCss::Value::toString((QString *)&pen,(Value *)&pen_1);
        lineHeight = (qreal)QString::toDouble((bool *)&pen);
        if (ok == true) {
          iVar10 = 1;
          if (((*(ushort *)&this->field_0x90 & 8) == 0) && ((int)pen_1.d.d.ptr == 1)) {
            lineHeight = lineHeight * 100.0;
            *(ushort *)&this->field_0x90 = *(ushort *)&this->field_0x90 | 0x10;
          }
        }
        else {
          lineHeight = 0.0;
          iVar10 = 0;
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pen);
        ::QVariant::~QVariant((QVariant *)&aStack_90);
      }
      if ((this->field_0x90 & 8) != 0) {
        iVar10 = QTextBlockFormat::lineHeightType(this_01);
      }
      QTextBlockFormat::setLineHeight(this_01,lineHeight,iVar10);
      break;
    case QtLineHeightType:
      pen.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::toString();
      iVar11 = QString::compare((QLatin1String *)&pen,0xc);
      iVar10 = 1;
      if (iVar11 != 0) {
        iVar11 = QString::compare((QLatin1String *)&pen,5);
        iVar10 = 2;
        if (iVar11 != 0) {
          iVar11 = QString::compare((QLatin1String *)&pen,7);
          iVar10 = 3;
          if (iVar11 != 0) {
            iVar10 = QString::compare((QLatin1String *)&pen,0xd);
            iVar10 = (uint)(iVar10 == 0) << 2;
          }
        }
      }
      if ((this->field_0x90 & 0x10) != 0) {
        qVar5 = QTextBlockFormat::lineHeight(this_01);
        ::QVariant::QVariant((QVariant *)&pen_1,qVar5 / 100.0);
        QTextFormat::setProperty(&this_01->super_QTextFormat,0x1048,(QVariant *)&pen_1);
        ::QVariant::~QVariant((QVariant *)&pen_1);
      }
      ::QVariant::QVariant((QVariant *)&pen_1,iVar10);
      QTextFormat::setProperty(&this_01->super_QTextFormat,0x1049,(QVariant *)&pen_1);
      ::QVariant::~QVariant((QVariant *)&pen_1);
      this->field_0x90 = this->field_0x90 | 8;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pen);
      break;
    case QtForegroundTextureCacheKey:
      if ((resourceProvider != (QTextDocument *)0x0) && (*(long *)&resourceProvider->field_0x8 != 0)
         ) {
        pen_1.d.d.ptr._0_1_ = 0xaa;
        searchKey = ::QVariant::toLongLong((bool *)&((pDVar16->values).d.ptr)->variant);
        if ((char)pen_1.d.d.ptr == '\x01') {
          applyForegroundImage(this,searchKey,resourceProvider);
        }
      }
      break;
    case TextDecorationColor:
      QPalette::QPalette((QPalette *)&pen);
      QVar18 = QCss::Declaration::colorValue((Declaration *)pal,(QPalette *)&pen);
      pen_1.d.d.ptr = QVar18._0_8_;
      aStack_90._0_6_ = QVar18.ct._4_6_;
      QTextCharFormat::setUnderlineColor(this_00,(QColor *)&pen_1);
LAB_00496c6d:
      QPalette::~QPalette((QPalette *)&pen);
      break;
    case QtStrokeWidth:
      pen_1.d.d.ptr = (DataPtr)(totally_ordered_wrapper<QPenPrivate_*>)0xffffffffffffffff;
      bVar8 = QCss::Declaration::realValue((Declaration *)pal,(qreal *)&pen_1,"px");
      if (bVar8) {
        pen.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
        QTextCharFormat::textOutline((QTextCharFormat *)&pen);
        QPen::setWidthF(&pen,(qreal)pen_1.d.d.ptr);
LAB_0049666e:
        QTextCharFormat::setTextOutline(this_00,&pen);
LAB_0049667c:
        QPen::~QPen(&pen);
      }
      break;
    case QtStrokeColor:
      lineHeight = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      QTextCharFormat::textOutline((QTextCharFormat *)&lineHeight);
      QPen::setStyle((QPen *)&lineHeight,SolidLine);
      QPalette::QPalette((QPalette *)&pen);
      QVar18 = QCss::Declaration::colorValue((Declaration *)pal,(QPalette *)&pen);
      pen_1.d.d.ptr = QVar18._0_8_;
      aStack_90._0_6_ = QVar18.ct._4_6_;
      QPen::setColor((QPen *)&lineHeight,(QColor *)&pen_1);
      QPalette::~QPalette((QPalette *)&pen);
      QTextCharFormat::setTextOutline(this_00,(QPen *)&lineHeight);
      QPen::~QPen((QPen *)&lineHeight);
      break;
    case QtStrokeLineCap:
      pen_1.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
      QTextCharFormat::textOutline((QTextCharFormat *)&pen_1);
      if (iVar10 - 0x34U < 3) {
        QPen::setCapStyle(&pen_1,*(PenCapStyle *)(&DAT_005fe808 + (ulong)(iVar10 - 0x34U) * 4));
      }
      goto LAB_004965da;
    case QtStrokeLineJoin:
      pen_1.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
      QTextCharFormat::textOutline((QTextCharFormat *)&pen_1);
      if (iVar10 - 0x37U < 4) {
        QPen::setJoinStyle(&pen_1,*(PenJoinStyle *)(&DAT_005fd350 + (ulong)(iVar10 - 0x37U) * 4));
      }
LAB_004965da:
      QTextCharFormat::setTextOutline(this_00,&pen_1);
      QPen::~QPen(&pen_1);
      break;
    case QtStrokeMiterLimit:
      pen_1.d.d.ptr = (DataPtr)(totally_ordered_wrapper<QPenPrivate_*>)0xffffffffffffffff;
      bVar8 = QCss::Declaration::realValue((Declaration *)pal,(qreal *)&pen_1,(char *)0x0);
      if (bVar8) {
        pen.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
        QTextCharFormat::textOutline((QTextCharFormat *)&pen);
        QPen::setMiterLimit(&pen,(qreal)pen_1.d.d.ptr);
        goto LAB_0049666e;
      }
      break;
    case QtStrokeDashArray:
      aStack_90._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pen_1.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
      aStack_90._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QCss::Declaration::dashArray((QList<double> *)&pen_1,(Declaration *)pal);
      if ((undefined1 *)aStack_90._8_8_ != (undefined1 *)0x0) {
        pen.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
        QTextCharFormat::textOutline((QTextCharFormat *)&pen);
        QPen::setDashPattern(&pen,(QList<double> *)&pen_1);
        QTextCharFormat::setTextOutline(this_00,&pen);
        QPen::~QPen(&pen);
      }
      QArrayDataPointer<double>::~QArrayDataPointer((QArrayDataPointer<double> *)&pen_1);
      break;
    case QtStrokeDashOffset:
      pen_1.d.d.ptr = (DataPtr)(totally_ordered_wrapper<QPenPrivate_*>)0xffffffffffffffff;
      bVar8 = QCss::Declaration::realValue((Declaration *)pal,(qreal *)&pen_1,(char *)0x0);
      if (bVar8) {
        pen.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
        QTextCharFormat::textOutline((QTextCharFormat *)&pen);
        QPen::setDashOffset(&pen,(qreal)pen_1.d.d.ptr);
        QTextCharFormat::setTextOutline(this_00,&pen);
        goto LAB_0049667c;
      }
      break;
    case QtForeground:
      pen.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
      QPalette::QPalette((QPalette *)&pen_1);
      QCss::Declaration::brushValue((Declaration *)&pen,pal);
      QPalette::~QPalette((QPalette *)&pen_1);
      QTextFormat::setForeground(&this_00->super_QTextFormat,(QBrush *)&pen);
      QBrush::~QBrush((QBrush *)&pen);
      break;
    default:
      switch(PVar1) {
      case QtBlockIndent:
        iVar10 = ::QVariant::toInt((bool *)&((pDVar16->values).d.ptr)->variant);
        QTextBlockFormat::setIndent(this_01,iVar10);
        break;
      case QtListIndent:
        bVar8 = QCss::Declaration::intValue((Declaration *)pal,&this->cssListIndent,(char *)0x0);
        if (bVar8) {
          this->field_0x90 = this->field_0x90 | 0x20;
        }
        break;
      case QtParagraphType:
        ::QVariant::toString();
        iVar10 = QString::compare((QLatin1String *)&pen_1,5);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pen_1);
        if (iVar10 == 0) {
          this->field_0x90 = this->field_0x90 | 0x40;
        }
        break;
      case QtTableType:
        ::QVariant::toString();
        iVar10 = QString::compare((QLatin1String *)&pen_1,5);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pen_1);
        if (iVar10 == 0) {
          this->field_0x90 = this->field_0x90 | 0x80;
        }
        else {
          ::QVariant::toString();
          iVar10 = QString::compare((QLatin1String *)&pen_1,4);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pen_1);
          if (iVar10 == 0) {
            *(ushort *)&this->field_0x90 = *(ushort *)&this->field_0x90 | 0x180;
          }
        }
        break;
      case QtUserState:
        iVar10 = ::QVariant::toInt((bool *)&((pDVar16->values).d.ptr)->variant);
        this->userState = iVar10;
        break;
      case TextDecoration:
      case QtSelectionForeground:
      case QtSelectionBackground:
      case BorderLeft:
      case BorderRight:
      case BorderTop:
      case BorderBottom:
      case Padding:
      case PaddingLeft:
      case PaddingRight:
      case PaddingTop:
      case PaddingBottom:
      case QtAlternateBackground:
      case BorderLeftStyle:
      case BorderRightStyle:
      case BorderTopStyle:
      case BorderBottomStyle:
      case BorderLeftColor:
      case BorderRightColor:
      case BorderTopColor:
      case BorderBottomColor:
        break;
      case TextIndent:
        pen_1.d.d.ptr = (DataPtr)(totally_ordered_wrapper<QPenPrivate_*>)0x0;
        bVar8 = QCss::Declaration::realValue((Declaration *)pal,(qreal *)&pen_1,"px");
        if (bVar8) {
          QTextBlockFormat::setTextIndent(this_01,(qreal)pen_1.d.d.ptr);
        }
        break;
      case TextUnderlineStyle:
        switch(iVar10) {
        case 0x19:
          style = SingleUnderline;
          break;
        case 0x1a:
          style = DotLine;
          break;
        case 0x1b:
          style = DashUnderline;
          break;
        case 0x1c:
          style = DashDotLine;
          break;
        case 0x1d:
          style = DashDotDotLine;
          break;
        default:
          goto switchD_00495f22_caseD_13;
        case 0x23:
          style = WaveUnderline;
          break;
        case 0x27:
          style = NoUnderline;
        }
        QTextCharFormat::setUnderlineStyle(this_00,style);
        break;
      case VerticalAlignment:
        switch(iVar10) {
        case 0x11:
          alignment = AlignSubScript;
          break;
        case 0x12:
          alignment = AlignSuperScript;
          break;
        case 0x13:
        case 0x14:
switchD_00496ab5_caseD_13:
          alignment = AlignNormal;
          break;
        case 0x15:
          alignment = AlignTop;
          break;
        case 0x16:
          alignment = AlignBottom;
          break;
        default:
          if (iVar10 != 0x24) goto switchD_00496ab5_caseD_13;
          alignment = AlignMiddle;
        }
        QTextCharFormat::setVerticalAlignment(this_00,alignment);
        break;
      case Whitespace:
        switch(iVar10) {
        case 1:
          this->wsm = WhiteSpaceNormal;
          break;
        case 2:
          this->wsm = WhiteSpacePre;
          break;
        case 3:
          this->wsm = WhiteSpaceNoWrap;
          break;
        case 4:
          this->wsm = WhiteSpacePreLine;
          break;
        case 5:
          this->wsm = WhiteSpacePreWrap;
        }
        break;
      case Border:
        aStack_90._8_8_ = (undefined1 *)0xffffffffffffffff;
        aStack_90._16_8_ = (undefined1 *)0xffffffffffffffff;
        pen_1.d.d.ptr = (DataPtr)(totally_ordered_wrapper<QPenPrivate_*>)0xffffffffffffffff;
        aStack_90._0_8_ = (double *)0xffffffffffffffff;
        pen.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
        lVar15 = 0;
        do {
          QBrush::QBrush((QBrush *)((long)&pen.d.d.ptr + lVar15));
          lVar15 = lVar15 + 8;
        } while (lVar15 != 0x20);
        lineHeight = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        bVar8 = applyCssDeclarations::anon_class_8_1_068654c4::operator()
                          (&local_e0,(qreal *)&pen_1,(QBrush *)&pen,(BorderStyle *)&lineHeight);
        if (bVar8) {
          this->tableBorder = (qreal)pen_1.d.d.ptr;
          if (*(int *)((long)pen.d.d.ptr + 8) != 0) {
            QBrush::operator=(&this->borderBrush,(QBrush *)&pen);
          }
          if (lineHeight._0_4_ != ~BorderStyle_None) {
            this->borderStyle = lineHeight._0_4_;
          }
        }
        lVar15 = 0x18;
        do {
          QBrush::~QBrush((QBrush *)((long)&pen.d.d.ptr + lVar15));
          lVar15 = lVar15 + -8;
        } while (lVar15 != -8);
        break;
      case BorderCollapse:
        bVar8 = QCss::Declaration::borderCollapseValue((Declaration *)pal);
        this->borderCollapse = bVar8;
        break;
      case PageBreakBefore:
        if (iVar10 == 0x25) {
          PVar13 = QTextBlockFormat::pageBreakPolicy(this_01);
          flags.i = (uint)PVar13.super_QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4>.
                          super_QFlagsStorage<QTextFormat::PageBreakFlag>.i & 0xfffffffe;
        }
        else {
          if (iVar10 != 0x26) break;
          PVar13 = QTextBlockFormat::pageBreakPolicy(this_01);
          flags.i = (uint)PVar13.super_QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4>.
                          super_QFlagsStorage<QTextFormat::PageBreakFlag>.i | 1;
        }
        goto LAB_00496d4f;
      case PageBreakAfter:
        if (iVar10 == 0x25) {
          PVar13 = QTextBlockFormat::pageBreakPolicy(this_01);
          flags.i = (uint)PVar13.super_QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4>.
                          super_QFlagsStorage<QTextFormat::PageBreakFlag>.i & 0xffffffef;
        }
        else {
          if (iVar10 != 0x26) break;
          PVar13 = QTextBlockFormat::pageBreakPolicy(this_01);
          flags.i = (uint)PVar13.super_QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4>.
                          super_QFlagsStorage<QTextFormat::PageBreakFlag>.i | 0x10;
        }
LAB_00496d4f:
        QTextBlockFormat::setPageBreakPolicy(this_01,(PageBreakFlags)flags.i);
        break;
      case BorderStyles:
        BVar12 = QCss::Declaration::styleValue((Declaration *)pal);
        if ((BVar12 != BorderStyle_Unknown) &&
           (BVar12 = QCss::Declaration::styleValue((Declaration *)pal), BVar12 != BorderStyle_Native
           )) {
          BVar12 = QCss::Declaration::styleValue((Declaration *)pal);
          this->borderStyle = BVar12 - BorderStyle_Dotted;
        }
        break;
      case BorderColor:
        aStack_90._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        aStack_90._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        pen_1.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
        aStack_90._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        lVar15 = 0;
        do {
          QBrush::QBrush((QBrush *)((long)&pen_1.d.d.ptr + lVar15));
          lVar15 = lVar15 + 8;
        } while (lVar15 != 0x20);
        QPalette::QPalette((QPalette *)&pen);
        QCss::Declaration::brushValues((Declaration *)pal,(QBrush *)&pen_1,(QPalette *)&pen);
        QPalette::~QPalette((QPalette *)&pen);
        if (*(int *)((long)pen_1.d.d.ptr + 8) != 0) {
          QBrush::operator=(&this->borderBrush,(QBrush *)&pen_1);
        }
        lVar15 = 0x18;
        do {
          QBrush::~QBrush((QBrush *)((long)&pen_1.d.d.ptr + lVar15));
          lVar15 = lVar15 + -8;
        } while (lVar15 != -8);
        break;
      default:
        if (PVar1 == Color) {
          QPalette::QPalette((QPalette *)&pen);
          QVar18 = QCss::Declaration::colorValue((Declaration *)pal,(QPalette *)&pen);
          pen_1.d.d.ptr = QVar18._0_8_;
          aStack_90._0_6_ = QVar18.ct._4_6_;
          QBrush::QBrush((QBrush *)&lineHeight,(QColor *)&pen_1,SolidPattern);
          QTextFormat::setForeground(&this_00->super_QTextFormat,(QBrush *)&lineHeight);
          QBrush::~QBrush((QBrush *)&lineHeight);
          goto LAB_00496c6d;
        }
        if (PVar1 == Float) {
          uVar9 = *(ushort *)&this->field_0x90 & 0xfffc;
          *(ushort *)&this->field_0x90 = uVar9;
          if (iVar10 == 0x14) {
            uVar9 = uVar9 | 2;
          }
          else {
            if (iVar10 != 0x13) break;
            uVar9 = uVar9 | 1;
          }
          *(ushort *)&this->field_0x90 = uVar9;
        }
        else if (PVar1 == BorderWidth) {
          pen_1.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
          aStack_90._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QCss::ValueExtractor::lengthValues(&extractor,(Declaration *)pal,(int *)&pen_1);
          this->tableBorder = (double)(int)pen_1.d.d.ptr;
        }
        else if ((PVar1 == MaximumWidth) && (this->id == Html_img)) {
          pen_1.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
          aStack_90._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QTextFormat::toImageFormat((QTextFormat *)&pen_1);
          QVar19 = QCss::ValueExtractor::textLength(&extractor,(Declaration *)pal);
          maxWidth._4_4_ = 0;
          maxWidth.lengthType = QVar19.lengthType;
          maxWidth.fixedValueOrPercentage = QVar19.fixedValueOrPercentage;
          QTextImageFormat::setMaximumWidth((QTextImageFormat *)&pen_1,maxWidth);
          QTextFormat::operator=(&this_00->super_QTextFormat,(QTextFormat *)&pen_1);
          QTextFormat::~QTextFormat((QTextFormat *)&pen_1);
        }
      }
    }
switchD_00495f22_caseD_13:
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

void QTextHtmlParserNode::applyCssDeclarations(const QList<QCss::Declaration> &declarations, const QTextDocument *resourceProvider)
{
    QCss::ValueExtractor extractor(declarations);
    extractor.extractBox(margin, padding);

    auto getBorderValues = [&extractor](qreal *borderWidth, QBrush *borderBrush, QTextFrameFormat::BorderStyle *borderStyles) {
        QCss::BorderStyle cssStyles[4];
        int cssBorder[4];
        QSize cssRadii[4]; // unused
        for (int i = 0; i < 4; ++i) {
            cssStyles[i] = QCss::BorderStyle_None;
            cssBorder[i] = 0;
        }
        // this will parse (and cache) "border-width" as a list so the
        // QCss::BorderWidth parsing below which expects a single value
        // will not work as expected - which in this case does not matter
        // because tableBorder is not relevant for cells.
        bool hit = extractor.extractBorder(cssBorder, borderBrush, cssStyles, cssRadii);
        for (int i = 0; i < 4; ++i) {
            borderStyles[i] = toQTextFrameFormat(cssStyles[i]);
            borderWidth[i] = static_cast<qreal>(cssBorder[i]);
        }
        return hit;
    };

    if (id == Html_td || id == Html_th)
        getBorderValues(tableCellBorder, tableCellBorderBrush, tableCellBorderStyle);

    for (int i = 0; i < declarations.size(); ++i) {
        const QCss::Declaration &decl = declarations.at(i);
        if (decl.d->values.isEmpty()) continue;

        QCss::KnownValue identifier = QCss::UnknownValue;
        if (decl.d->values.constFirst().type == QCss::Value::KnownIdentifier)
            identifier = static_cast<QCss::KnownValue>(decl.d->values.constFirst().variant.toInt());

        switch (decl.d->propertyId) {
        case QCss::BorderColor: {
            QBrush bordersBrush[4];
            decl.brushValues(bordersBrush);
            if (bordersBrush[0].color().isValid())
                borderBrush = bordersBrush[0];
            break;
        }
        case QCss::BorderStyles:
            if (decl.styleValue() != QCss::BorderStyle_Unknown && decl.styleValue() != QCss::BorderStyle_Native)
                borderStyle = static_cast<QTextFrameFormat::BorderStyle>(decl.styleValue() - 1);
            break;
        case QCss::BorderWidth: {
            int borders[4];
            extractor.lengthValues(decl, borders);
            tableBorder = borders[0];
            }
            break;
        case QCss::Border: {
            qreal tblBorder[4];
            QBrush tblBorderBrush[4];
            QTextFrameFormat::BorderStyle tblBorderStyle[4];
            if (getBorderValues(tblBorder, tblBorderBrush, tblBorderStyle)) {
                tableBorder = tblBorder[0];
                if (tblBorderBrush[0].color().isValid())
                    borderBrush = tblBorderBrush[0];
                if (tblBorderStyle[0] != static_cast<QTextFrameFormat::BorderStyle>(-1))
                    borderStyle = tblBorderStyle[0];
            }
        }
        break;
        case QCss::BorderCollapse:
            borderCollapse = decl.borderCollapseValue();
            break;
        case QCss::Color: charFormat.setForeground(decl.colorValue()); break;
        case QCss::Float:
            cssFloat = QTextFrameFormat::InFlow;
            switch (identifier) {
            case QCss::Value_Left: cssFloat = QTextFrameFormat::FloatLeft; break;
            case QCss::Value_Right: cssFloat = QTextFrameFormat::FloatRight; break;
            default: break;
            }
            break;
        case QCss::QtBlockIndent:
            blockFormat.setIndent(decl.d->values.constFirst().variant.toInt());
            break;
        case QCss::QtLineHeightType: {
            QString lineHeightTypeName = decl.d->values.constFirst().variant.toString();
            QTextBlockFormat::LineHeightTypes lineHeightType;
            if (lineHeightTypeName.compare("proportional"_L1, Qt::CaseInsensitive) == 0)
                lineHeightType = QTextBlockFormat::ProportionalHeight;
            else if (lineHeightTypeName.compare("fixed"_L1, Qt::CaseInsensitive) == 0)
                lineHeightType = QTextBlockFormat::FixedHeight;
            else if (lineHeightTypeName.compare("minimum"_L1, Qt::CaseInsensitive) == 0)
                lineHeightType = QTextBlockFormat::MinimumHeight;
            else if (lineHeightTypeName.compare("line-distance"_L1, Qt::CaseInsensitive) == 0)
                lineHeightType = QTextBlockFormat::LineDistanceHeight;
            else
                lineHeightType = QTextBlockFormat::SingleHeight;

            if (hasLineHeightMultiplier) {
                qreal lineHeight = blockFormat.lineHeight() / 100.0;
                blockFormat.setProperty(QTextBlockFormat::LineHeight, lineHeight);
            }

            blockFormat.setProperty(QTextBlockFormat::LineHeightType, lineHeightType);
            hasOwnLineHeightType = true;
        }
        break;
        case QCss::LineHeight: {
            qreal lineHeight;
            QTextBlockFormat::LineHeightTypes lineHeightType;
            if (decl.realValue(&lineHeight, "px")) {
                lineHeightType = QTextBlockFormat::MinimumHeight;
            } else {
                bool ok;
                QCss::Value cssValue = decl.d->values.constFirst();
                QString value = cssValue.toString();
                lineHeight = value.toDouble(&ok);
                if (ok) {
                    if (!hasOwnLineHeightType && cssValue.type == QCss::Value::Number) {
                        lineHeight *= 100.0;
                        hasLineHeightMultiplier = true;
                    }
                    lineHeightType = QTextBlockFormat::ProportionalHeight;
                } else {
                    lineHeight = 0.0;
                    lineHeightType = QTextBlockFormat::SingleHeight;
                }
            }

            // Only override line height type if specified in same node
            if (hasOwnLineHeightType)
                lineHeightType = QTextBlockFormat::LineHeightTypes(blockFormat.lineHeightType());

            blockFormat.setLineHeight(lineHeight, lineHeightType);
            break;
        }
        case QCss::TextIndent: {
            qreal indent = 0;
            if (decl.realValue(&indent, "px"))
                blockFormat.setTextIndent(indent);
            break; }
        case QCss::QtListIndent:
            if (decl.intValue(&cssListIndent))
                hasCssListIndent = true;
            break;
        case QCss::QtParagraphType:
            if (decl.d->values.constFirst().variant.toString().compare("empty"_L1, Qt::CaseInsensitive) == 0)
                isEmptyParagraph = true;
            break;
        case QCss::QtTableType:
            if (decl.d->values.constFirst().variant.toString().compare("frame"_L1, Qt::CaseInsensitive) == 0)
                isTextFrame = true;
            else if (decl.d->values.constFirst().variant.toString().compare("root"_L1, Qt::CaseInsensitive) == 0) {
                isTextFrame = true;
                isRootFrame = true;
            }
            break;
        case QCss::QtUserState:
            userState = decl.d->values.constFirst().variant.toInt();
            break;
        case QCss::Whitespace:
            switch (identifier) {
            case QCss::Value_Normal: wsm = QTextHtmlParserNode::WhiteSpaceNormal; break;
            case QCss::Value_Pre: wsm = QTextHtmlParserNode::WhiteSpacePre; break;
            case QCss::Value_NoWrap: wsm = QTextHtmlParserNode::WhiteSpaceNoWrap; break;
            case QCss::Value_PreWrap: wsm = QTextHtmlParserNode::WhiteSpacePreWrap; break;
            case QCss::Value_PreLine: wsm = QTextHtmlParserNode::WhiteSpacePreLine; break;
            default: break;
            }
            break;
        case QCss::VerticalAlignment:
            switch (identifier) {
            case QCss::Value_Sub: charFormat.setVerticalAlignment(QTextCharFormat::AlignSubScript); break;
            case QCss::Value_Super: charFormat.setVerticalAlignment(QTextCharFormat::AlignSuperScript); break;
            case QCss::Value_Middle: charFormat.setVerticalAlignment(QTextCharFormat::AlignMiddle); break;
            case QCss::Value_Top: charFormat.setVerticalAlignment(QTextCharFormat::AlignTop); break;
            case QCss::Value_Bottom: charFormat.setVerticalAlignment(QTextCharFormat::AlignBottom); break;
            default: charFormat.setVerticalAlignment(QTextCharFormat::AlignNormal); break;
            }
            break;
        case QCss::PageBreakBefore:
            switch (identifier) {
            case QCss::Value_Always: blockFormat.setPageBreakPolicy(blockFormat.pageBreakPolicy() | QTextFormat::PageBreak_AlwaysBefore); break;
            case QCss::Value_Auto: blockFormat.setPageBreakPolicy(blockFormat.pageBreakPolicy() & ~QTextFormat::PageBreak_AlwaysBefore); break;
            default: break;
            }
            break;
        case QCss::PageBreakAfter:
            switch (identifier) {
            case QCss::Value_Always: blockFormat.setPageBreakPolicy(blockFormat.pageBreakPolicy() | QTextFormat::PageBreak_AlwaysAfter); break;
            case QCss::Value_Auto: blockFormat.setPageBreakPolicy(blockFormat.pageBreakPolicy() & ~QTextFormat::PageBreak_AlwaysAfter); break;
            default: break;
            }
            break;
        case QCss::TextUnderlineStyle:
            switch (identifier) {
            case QCss::Value_None: charFormat.setUnderlineStyle(QTextCharFormat::NoUnderline); break;
            case QCss::Value_Solid: charFormat.setUnderlineStyle(QTextCharFormat::SingleUnderline); break;
            case QCss::Value_Dashed: charFormat.setUnderlineStyle(QTextCharFormat::DashUnderline); break;
            case QCss::Value_Dotted: charFormat.setUnderlineStyle(QTextCharFormat::DotLine); break;
            case QCss::Value_DotDash: charFormat.setUnderlineStyle(QTextCharFormat::DashDotLine); break;
            case QCss::Value_DotDotDash: charFormat.setUnderlineStyle(QTextCharFormat::DashDotDotLine); break;
            case QCss::Value_Wave: charFormat.setUnderlineStyle(QTextCharFormat::WaveUnderline); break;
            default: break;
            }
            break;
        case QCss::TextDecorationColor: charFormat.setUnderlineColor(decl.colorValue()); break;
        case QCss::ListStyleType:
        case QCss::ListStyle:
            setListStyle(decl.d->values);
            break;
        case QCss::QtListNumberPrefix:
            textListNumberPrefix = decl.d->values.constFirst().variant.toString();
            break;
        case QCss::QtListNumberSuffix:
            textListNumberSuffix = decl.d->values.constFirst().variant.toString();
            break;
        case QCss::TextAlignment:
            switch (identifier) {
            case QCss::Value_Left: blockFormat.setAlignment(Qt::AlignLeft); break;
            case QCss::Value_Center: blockFormat.setAlignment(Qt::AlignCenter); break;
            case QCss::Value_Right: blockFormat.setAlignment(Qt::AlignRight); break;
            default: break;
            }
            break;

        case QCss::QtForegroundTextureCacheKey:
        {
            if (resourceProvider != nullptr && QTextDocumentPrivate::get(resourceProvider) != nullptr) {
                bool ok;
                qint64 searchKey = decl.d->values.constFirst().variant.toLongLong(&ok);
                if (ok)
                    applyForegroundImage(searchKey, resourceProvider);
            }
            break;
        }
        case QCss::QtStrokeColor:
        {
            QPen pen = charFormat.textOutline();
            pen.setStyle(Qt::SolidLine);
            pen.setColor(decl.colorValue());
            charFormat.setTextOutline(pen);
            break;
        }
        case QCss::QtStrokeWidth:
        {
            qreal width;
            if (decl.realValue(&width, "px")) {
                QPen pen = charFormat.textOutline();
                pen.setWidthF(width);
                charFormat.setTextOutline(pen);
            }
            break;
        }
        case QCss::QtStrokeLineCap:
        {
            QPen pen = charFormat.textOutline();
            switch (identifier) {
            case QCss::Value_SquareCap: pen.setCapStyle(Qt::SquareCap); break;
            case QCss::Value_FlatCap: pen.setCapStyle(Qt::FlatCap); break;
            case QCss::Value_RoundCap: pen.setCapStyle(Qt::RoundCap); break;
            default: break;
            }
            charFormat.setTextOutline(pen);
            break;
        }
        case QCss::QtStrokeLineJoin:
        {
            QPen pen = charFormat.textOutline();
            switch (identifier) {
            case QCss::Value_MiterJoin: pen.setJoinStyle(Qt::MiterJoin); break;
            case QCss::Value_BevelJoin: pen.setJoinStyle(Qt::BevelJoin); break;
            case QCss::Value_RoundJoin: pen.setJoinStyle(Qt::RoundJoin); break;
            case QCss::Value_SvgMiterJoin: pen.setJoinStyle(Qt::SvgMiterJoin); break;
            default: break;
            }
            charFormat.setTextOutline(pen);
            break;
        }
        case QCss::QtStrokeMiterLimit:
        {
            qreal miterLimit;
            if (decl.realValue(&miterLimit)) {
                QPen pen = charFormat.textOutline();
                pen.setMiterLimit(miterLimit);
                charFormat.setTextOutline(pen);
            }
            break;
        }
        case QCss::QtStrokeDashArray:
        {
            QList<qreal> dashes = decl.dashArray();
            if (!dashes.empty()) {
                QPen pen = charFormat.textOutline();
                pen.setDashPattern(dashes);
                charFormat.setTextOutline(pen);
            }
            break;
        }
        case QCss::QtStrokeDashOffset:
        {
            qreal dashOffset;
            if (decl.realValue(&dashOffset)) {
                QPen pen = charFormat.textOutline();
                pen.setDashOffset(dashOffset);
                charFormat.setTextOutline(pen);
            }
            break;
        }
        case QCss::QtForeground:
        {
            QBrush brush = decl.brushValue();
            charFormat.setForeground(brush);
            break;
        }
        case QCss::MaximumWidth:
            if (id == Html_img) {
                auto imageFormat = charFormat.toImageFormat();
                imageFormat.setMaximumWidth(extractor.textLength(decl));
                charFormat = imageFormat;
            }
            break;
        default: break;
        }
    }

    QFont f;
    int adjustment = -255;
    extractor.extractFont(&f, &adjustment);
    if (f.pixelSize() > INT32_MAX / 2)
        f.setPixelSize(INT32_MAX / 2);   // avoid even more extreme values
    charFormat.setFont(f, QTextCharFormat::FontPropertiesSpecifiedOnly);

    if (adjustment >= -1)
        charFormat.setProperty(QTextFormat::FontSizeAdjustment, adjustment);

    {
        Qt::Alignment ignoredAlignment;
        QCss::Repeat ignoredRepeat;
        QString bgImage;
        QBrush bgBrush;
        QCss::Origin ignoredOrigin, ignoredClip;
        QCss::Attachment ignoredAttachment;
        extractor.extractBackground(&bgBrush, &bgImage, &ignoredRepeat, &ignoredAlignment,
                                    &ignoredOrigin, &ignoredAttachment, &ignoredClip);

        if (!bgImage.isEmpty() && resourceProvider) {
            applyBackgroundImage(bgImage, resourceProvider);
        } else if (bgBrush.style() != Qt::NoBrush) {
            charFormat.setBackground(bgBrush);
            if (id == Html_hr)
                blockFormat.setProperty(QTextFormat::BackgroundBrush, bgBrush);
        }
    }
}